

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O0

errr finish_parse_profile(parser *p)

{
  ushort uVar1;
  undefined8 *puVar2;
  room_profile *prVar3;
  uint uVar4;
  room_profile *prVar5;
  room_profile *r_temp;
  wchar_t i;
  room_profile *r_new;
  room_profile *r_old;
  undefined8 *puStack_20;
  wchar_t num;
  cave_profile *c;
  cave_profile *n;
  parser *p_local;
  
  puStack_20 = (undefined8 *)parser_priv(p);
  z_info->profile_max = 0;
  for (; puStack_20 != (undefined8 *)0x0; puStack_20 = (undefined8 *)*puStack_20) {
    z_info->profile_max = z_info->profile_max + 1;
  }
  cave_profiles = (cave_profile *)mem_zalloc((ulong)z_info->profile_max << 7);
  uVar1 = z_info->profile_max;
  puStack_20 = (undefined8 *)parser_priv(p);
  uVar4 = (uint)uVar1;
  while (r_old._4_4_ = uVar4 - 1, puStack_20 != (undefined8 *)0x0) {
    memcpy(cave_profiles + (int)r_old._4_4_,puStack_20,0x80);
    puVar2 = (undefined8 *)*puStack_20;
    if ((int)r_old._4_4_ < (int)(z_info->profile_max - 1)) {
      cave_profiles[(int)r_old._4_4_].next = cave_profiles + (int)uVar4;
    }
    else {
      cave_profiles[(int)r_old._4_4_].next = (cave_profile *)0x0;
    }
    if (puStack_20[0xe] == 0) {
      cave_profiles[(int)r_old._4_4_].n_room_profiles = L'\0';
      cave_profiles[(int)r_old._4_4_].room_profiles = (room_profile *)0x0;
    }
    else {
      r_new = (room_profile *)puStack_20[0xe];
      cave_profiles[(int)r_old._4_4_].n_room_profiles = L'\0';
      for (; r_new != (room_profile *)0x0; r_new = r_new->next) {
        cave_profiles[(int)r_old._4_4_].n_room_profiles =
             cave_profiles[(int)r_old._4_4_].n_room_profiles + L'\x01';
      }
      prVar5 = (room_profile *)
               mem_zalloc((long)cave_profiles[(int)r_old._4_4_].n_room_profiles * 0x38);
      r_new = (room_profile *)puStack_20[0xe];
      for (r_temp._4_4_ = L'\0'; r_temp._4_4_ < cave_profiles[(int)r_old._4_4_].n_room_profiles;
          r_temp._4_4_ = r_temp._4_4_ + L'\x01') {
        memcpy(prVar5 + r_temp._4_4_,r_new,0x38);
        if (prVar5[r_temp._4_4_].next != (room_profile *)0x0) {
          prVar5[r_temp._4_4_].next = prVar5 + (r_temp._4_4_ + L'\x01');
        }
        prVar3 = r_new->next;
        mem_free(r_new);
        r_new = prVar3;
      }
      cave_profiles[(int)r_old._4_4_].room_profiles = prVar5;
    }
    mem_free(puStack_20);
    puStack_20 = puVar2;
    uVar4 = r_old._4_4_;
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_profile(struct parser *p) {
	struct cave_profile *n, *c = parser_priv(p);
	int num;

	/* Count the list */
	z_info->profile_max = 0;
	while (c) {
		z_info->profile_max++;
		c = c->next;
	}

	/* Allocate the array and copy the records to it */
	cave_profiles = mem_zalloc(z_info->profile_max * sizeof(*c));
	num = z_info->profile_max - 1;
	for (c = parser_priv(p); c; c = n) {
		/* Main record */
		memcpy(&cave_profiles[num], c, sizeof(*c));
		n = c->next;
		if (num < z_info->profile_max - 1) {
			cave_profiles[num].next = &cave_profiles[num + 1];
		} else {
			cave_profiles[num].next = NULL;
		}

		if (c->room_profiles) {
			struct room_profile *r_old = c->room_profiles;
			struct room_profile *r_new;
			int i;

			/* Count the room profiles */
			cave_profiles[num].n_room_profiles = 0;
			while (r_old) {
				++cave_profiles[num].n_room_profiles;
				r_old = r_old->next;
			}

			/* Now allocate the room profile array */
			r_new = mem_zalloc(cave_profiles[num].n_room_profiles
				* sizeof(*r_new));

			r_old = c->room_profiles;
			for (i = 0; i < cave_profiles[num].n_room_profiles; i++) {
				struct room_profile *r_temp = r_old;

				/* Copy from the linked list to the array */
				memcpy(&r_new[i], r_old, sizeof(*r_old));

				/* Set the next profile pointer correctly. */
				if (r_new[i].next) {
					r_new[i].next = &r_new[i + 1];
				}

				/* Tidy up and advance to the next profile. */
				r_old = r_old->next;
				mem_free(r_temp);
			}

			cave_profiles[num].room_profiles = r_new;
		} else {
			cave_profiles[num].n_room_profiles = 0;
			cave_profiles[num].room_profiles = NULL;
		}

		mem_free(c);
		num--;
	}

	parser_destroy(p);
	return 0;
}